

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,BinaryOperator *b)

{
  Category CVar1;
  Op OVar2;
  Structure *o;
  long lVar3;
  int iVar4;
  pool_ptr<soul::AST::Constant> rhsConst;
  pool_ptr<soul::AST::Constant> lhsConst;
  long local_88;
  long local_80;
  Type local_78;
  CompileMessage local_60;
  
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(b->lhs).object);
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(b->rhs).object);
  throwErrorIfNotReadableValue((b->rhs).object);
  iVar4 = (*(b->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[9])(b);
  if ((char)iVar4 != '\0') {
    return;
  }
  throwErrorIfNotReadableValue((b->lhs).object);
  AST::BinaryOperator::resolveOpTypes(b);
  CVar1 = (b->resolvedOpTypes).operandType.category;
  o = (b->resolvedOpTypes).operandType.structure.object;
  if (o != (Structure *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  if (CVar1 == invalid) {
    throwErrorForBinaryOperatorTypes(b);
  }
  if ((b->operation & ~divide) != lessThan) goto LAB_0020114d;
  (*(((b->lhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_80);
  (*(((b->rhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_88);
  lVar3 = local_80;
  if (local_80 == 0) {
    iVar4 = 0;
LAB_0020110a:
    if (local_88 != 0) {
      OVar2 = b->operation;
      (*(((b->lhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_78);
      if (local_88 == 0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      iVar4 = BinaryOp::getResultOfComparisonWithBoundedType
                        (OVar2,&local_78,(Value *)(local_88 + 0x30));
      RefCountedPtr<soul::Structure>::decIfNotNull(local_78.structure.object);
    }
  }
  else {
    if (local_88 != 0) goto LAB_0020114d;
    OVar2 = b->operation;
    (*(((b->rhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_78);
    iVar4 = 0;
    if ((OVar2 & ~divide) == lessThan) {
      iVar4 = BinaryOp::getResultOfComparisonWithBoundedType
                        ((leftShift|notEquals) - OVar2,&local_78,(Value *)(lVar3 + 0x30));
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_78.structure.object);
    if (local_80 == 0) goto LAB_0020110a;
  }
  if (iVar4 != 0) {
    if (iVar4 < 1) {
      CompileMessageHelpers::createMessage<>
                (&local_60,syntax,error,"Comparison with bounded integer type is always false");
    }
    else {
      CompileMessageHelpers::createMessage<>
                (&local_60,syntax,error,"Comparison with bounded integer type is always true");
    }
    AST::Context::throwError
              (&(b->super_Expression).super_Statement.super_ASTObject.context,&local_60,false);
  }
LAB_0020114d:
  RefCountedPtr<soul::Structure>::decIfNotNull(o);
  return;
}

Assistant:

void visit (AST::BinaryOperator& b) override
        {
            super::visit (b);

            throwErrorIfNotReadableValue (b.rhs);

            if (b.isOutputEndpoint())
                return;

            throwErrorIfNotReadableValue (b.lhs);

            auto operandType = b.getOperandType();

            if (! operandType.isValid())
                throwErrorForBinaryOperatorTypes (b);

            if (BinaryOp::isComparisonOperator (b.operation))
            {
                auto lhsConst = b.lhs->getAsConstant();
                auto rhsConst = b.rhs->getAsConstant();
                int result = 0;

                if (lhsConst != nullptr && rhsConst == nullptr)
                    result = BinaryOp::getResultOfComparisonWithBoundedType (b.operation, lhsConst->value, b.rhs->getResultType());

                if (lhsConst == nullptr && rhsConst != nullptr)
                    result = BinaryOp::getResultOfComparisonWithBoundedType (b.operation, b.lhs->getResultType(), rhsConst->value);

                if (result != 0)
                    b.context.throwError (result > 0 ? Errors::comparisonAlwaysTrue()
                                                     : Errors::comparisonAlwaysFalse());
            }
        }